

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_constructor.h
# Opt level: O2

duk_ret_t dukglue::detail::call_native_constructor<false,Rectangle,int,int,int,int>
                    (duk_context *ctx)

{
  duk_bool_t dVar1;
  Rectangle *val;
  type constructor_args;
  
  dVar1 = duk_is_constructor_call(ctx);
  if (dVar1 != 0) {
    get_stack_values_helper<int,int,int,int,0ul,1ul,2ul,3ul>(&constructor_args,ctx);
    val = apply_constructor<Rectangle,int,int,int,int>(&constructor_args);
    duk_push_this(ctx);
    duk_push_pointer(ctx,val);
    duk_put_prop_string(ctx,-2,anon_var_dwarf_c2e7);
    RefManager::register_native_object(ctx,val);
    duk_pop(ctx);
    return 0;
  }
  duk_error_raw(ctx,-6,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_constructor.h"
                ,0xd,"Constructor must be called with new T().");
}

Assistant:

static duk_ret_t call_native_constructor(duk_context* ctx)
    {
      if (!duk_is_constructor_call(ctx)) {
        duk_error(ctx, DUK_RET_TYPE_ERROR, "Constructor must be called with new T().");
        return DUK_RET_TYPE_ERROR;
      }

      // construct the new instance
      auto constructor_args = dukglue::detail::get_stack_values<Ts...>(ctx);
      Cls* obj = dukglue::detail::apply_constructor<Cls>(std::move(constructor_args));

      duk_push_this(ctx);

      // make the new script object keep the pointer to the new object instance
      duk_push_pointer(ctx, obj);
      duk_put_prop_string(ctx, -2, "\xFF" "obj_ptr");

      // register it
	  if (!managed)
		dukglue::detail::RefManager::register_native_object(ctx, obj);

      duk_pop(ctx); // pop this

      return 0;
    }